

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLinLin>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLinLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  unsigned_long_long uVar1;
  ImVec2 IVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ImU32 IVar8;
  uint uVar9;
  GetterXsYs<unsigned_long_long> *pGVar10;
  GetterXsYRef<unsigned_long_long> *pGVar11;
  ImDrawVert *pIVar12;
  ImDrawIdx *pIVar13;
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  int iVar17;
  long lVar18;
  ImDrawIdx IVar19;
  ImPlotContext *gp;
  float fVar20;
  float fVar21;
  float fVar22;
  double dVar23;
  float fVar24;
  double dVar25;
  undefined1 auVar26 [16];
  ulong uVar27;
  float fVar28;
  float fVar29;
  float fVar35;
  double dVar36;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  pGVar10 = this->Getter1;
  pGVar11 = this->Getter2;
  iVar17 = pGVar10->Count;
  iVar6 = this->Transformer->YAxis;
  iVar7 = pGVar11->Count;
  uVar1 = *(unsigned_long_long *)
           ((long)pGVar11->Xs +
           (long)(((prim + pGVar11->Offset) % iVar7 + iVar7) % iVar7) * (long)pGVar11->Stride);
  lVar18 = (long)(((pGVar10->Offset + prim) % iVar17 + iVar17) % iVar17) * (long)pGVar10->Stride;
  uVar27 = *(ulong *)((long)pGVar10->Xs + lVar18);
  IVar2 = GImPlot->PixelRange[iVar6].Min;
  dVar23 = (double)IVar2.x;
  dVar25 = (double)IVar2.y;
  dVar3 = GImPlot->CurrentPlot->YAxis[iVar6].Range.Min;
  dVar4 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  uVar5 = *(ulong *)((long)pGVar10->Ys + lVar18);
  dVar36 = ((((double)(uVar27 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
            (double)(uVar27 & 0xffffffff | 0x4330000000000000)) - dVar4) * GImPlot->Mx + dVar23;
  fVar20 = (float)(((((double)(uVar5 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                    (double)(uVar5 & 0xffffffff | 0x4330000000000000)) - dVar3) * GImPlot->My[iVar6]
                  + dVar25);
  fVar21 = (float)dVar36;
  fVar22 = (float)((pGVar11->YRef - dVar3) * GImPlot->My[iVar6] + dVar25);
  fVar24 = (float)(((((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) - dVar4) *
                   GImPlot->Mx + dVar23);
  uVar27 = CONCAT44(-(uint)(fVar24 <= fVar21),-(uint)(fVar22 <= fVar20));
  auVar14._4_8_ = dVar36;
  auVar14._0_4_ = fVar21;
  auVar30._0_8_ = auVar14._0_8_ << 0x20;
  auVar30._8_4_ = fVar20;
  auVar30._12_4_ = fVar21;
  auVar15._4_8_ = auVar30._8_8_;
  auVar15._0_4_ = -(uint)(fVar21 < fVar24);
  auVar31._0_8_ = auVar15._0_8_ << 0x20;
  auVar31._8_4_ = -(uint)(fVar20 < fVar22);
  auVar31._12_4_ = -(uint)(fVar21 < fVar24);
  auVar26._0_8_ = CONCAT44(fVar21,fVar20) & uVar27;
  auVar26._8_8_ = CONCAT44(fVar21,fVar20) & auVar31._8_8_;
  auVar32._0_8_ = ~uVar27 & CONCAT44(fVar24,fVar22);
  auVar32._8_8_ = ~auVar31._8_8_ & CONCAT44(fVar24,fVar22);
  auVar32 = auVar32 | auVar26;
  fVar35 = (cull_rect->Min).x;
  auVar34._4_4_ = -(uint)(fVar35 < auVar32._4_4_);
  auVar34._0_4_ = -(uint)((cull_rect->Min).y < auVar32._0_4_);
  auVar16._4_8_ = auVar32._8_8_;
  auVar16._0_4_ = -(uint)(auVar32._4_4_ < fVar35);
  auVar33._0_8_ = auVar16._0_8_ << 0x20;
  auVar33._8_4_ = -(uint)(auVar32._8_4_ < (cull_rect->Max).y);
  auVar33._12_4_ = -(uint)(auVar32._12_4_ < (cull_rect->Max).x);
  auVar34._8_8_ = auVar33._8_8_;
  iVar17 = movmskps((int)cull_rect,auVar34);
  if (iVar17 == 0xf) {
    IVar8 = this->Col;
    IVar2 = *uv;
    fVar28 = fVar22 - fVar20;
    fVar35 = fVar24 - fVar21;
    fVar29 = fVar35 * fVar35 + fVar28 * fVar28;
    if (0.0 < fVar29) {
      fVar29 = 1.0 / SQRT(fVar29);
      fVar35 = fVar35 * fVar29;
      fVar28 = fVar28 * fVar29;
    }
    fVar29 = this->Weight * 0.5;
    pIVar12 = DrawList->_VtxWritePtr;
    fVar35 = fVar29 * fVar35;
    fVar29 = fVar29 * fVar28;
    (pIVar12->pos).x = fVar29 + fVar21;
    (pIVar12->pos).y = fVar20 - fVar35;
    (pIVar12->uv).x = IVar2.x;
    (pIVar12->uv).y = IVar2.y;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = IVar8;
    pIVar12[1].pos.x = fVar29 + fVar24;
    pIVar12[1].pos.y = fVar22 - fVar35;
    pIVar12[1].uv = IVar2;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = IVar8;
    pIVar12[2].pos.x = fVar24 - fVar29;
    pIVar12[2].pos.y = fVar35 + fVar22;
    pIVar12[2].uv = IVar2;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = IVar8;
    pIVar12[3].pos.x = fVar21 - fVar29;
    pIVar12[3].pos.y = fVar35 + fVar20;
    pIVar12[3].uv = IVar2;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = IVar8;
    DrawList->_VtxWritePtr = pIVar12 + 4;
    uVar9 = DrawList->_VtxCurrentIdx;
    pIVar13 = DrawList->_IdxWritePtr;
    IVar19 = (ImDrawIdx)uVar9;
    *pIVar13 = IVar19;
    pIVar13[1] = IVar19 + 1;
    pIVar13[2] = IVar19 + 2;
    pIVar13[3] = IVar19;
    pIVar13[4] = IVar19 + 2;
    pIVar13[5] = IVar19 + 3;
    DrawList->_IdxWritePtr = pIVar13 + 6;
    DrawList->_VtxCurrentIdx = uVar9 + 4;
  }
  return (char)iVar17 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }